

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RippleOP.cpp
# Opt level: O0

void __thiscall OpenMD::RippleOP::writeP2(RippleOP *this)

{
  char *pcVar1;
  ostream *poVar2;
  double *pdVar3;
  StaticAnalyser *in_RDI;
  ofstream os;
  ostream local_208 [520];
  
  StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar1,_S_out);
  poVar2 = std::operator<<(local_208,"#selection1: (");
  poVar2 = std::operator<<(poVar2,(string *)&in_RDI[1].info_);
  std::operator<<(poVar2,")\n");
  std::operator<<(local_208,"#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n");
  poVar2 = (ostream *)std::ostream::operator<<(local_208,*(double *)&in_RDI[0x11].analysisType_);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(double)in_RDI[0x11].data_.
                                     super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x11].analysisType_._M_string_length,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x11].analysisType_._M_string_length,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x11].analysisType_._M_string_length,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  std::operator<<(poVar2,"\n");
  poVar2 = (ostream *)std::ostream::operator<<(local_208,*(double *)&in_RDI[0x11].paramString_);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(double)in_RDI[0x11].outputTypes_.
                                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x11].paramString_._M_string_length,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x11].paramString_._M_string_length,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x11].paramString_._M_string_length,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_208,"selection2: (");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI[1].dumpFilename_.field_2._M_local_buf + 8));
  std::operator<<(poVar2,")\n");
  std::operator<<(local_208,"#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n");
  poVar2 = (ostream *)std::ostream::operator<<(local_208,*(double *)&in_RDI[0x12].dumpFilename_);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)&in_RDI[0x12].step_);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x12].dumpFilename_._M_string_length,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x12].dumpFilename_._M_string_length,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar3 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)&in_RDI[0x12].dumpFilename_._M_string_length,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
  std::operator<<(poVar2,"\n");
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void RippleOP::writeP2() {
    std::ofstream os(getOutputFileName().c_str());
    os << "#selection1: (" << selectionScript1_ << ")\n";
    os << "#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n";

    os << avgOPHeadUpper.p2 << "\t" << errOPHeadUpper.p2 << "\t"
       << avgOPHeadUpper.director[0] << "\t" << avgOPHeadUpper.director[1]
       << "\t" << avgOPHeadUpper.director[2] << "\n";

    os << avgOPHeadLower.p2 << "\t" << errOPHeadLower.p2 << "\t"
       << avgOPHeadLower.director[0] << "\t" << avgOPHeadLower.director[1]
       << "\t" << avgOPHeadLower.director[2] << "\n";

    os << "selection2: (" << selectionScript2_ << ")\n";
    os << "#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n";

    os << avgOPTail.p2 << "\t" << errOPTail.p2 << "\t" << avgOPTail.director[0]
       << "\t" << avgOPTail.director[1] << "\t" << avgOPTail.director[2]
       << "\n";
  }